

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O1

void __thiscall miniros::TransportUDP::disableRead(TransportUDP *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->close_mutex_);
  if (iVar2 == 0) {
    bVar1 = this->closed_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex_);
    if ((bVar1 == false) && (this->expecting_read_ == true)) {
      PollSet::delEvents(this->poll_set_,this->sock_,1);
      this->expecting_read_ = false;
    }
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void TransportUDP::disableRead()
{
  MINIROS_ASSERT(!(flags_ & SYNCHRONOUS));

  {
    std::scoped_lock<std::mutex> lock(close_mutex_);

    if (closed_)
    {
      return;
    }
  }

  if (expecting_read_)
  {
    poll_set_->delEvents(sock_, POLLIN);
    expecting_read_ = false;
  }
}